

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

ConstPixelBufferAccess *
vkt::image::anon_unknown_0::getLayerOrSlice
          (ConstPixelBufferAccess *__return_storage_ptr__,Texture *texture,
          ConstPixelBufferAccess *access,int layer)

{
  ConstPixelBufferAccess *pCVar1;
  uint uVar2;
  
  uVar2 = (uint)texture;
  if (7 < uVar2) {
    (__return_storage_ptr__->m_format).order = CHANNELORDER_LAST;
    (__return_storage_ptr__->m_format).type = CHANNELTYPE_LAST;
    (__return_storage_ptr__->m_size).m_data[0] = 0;
    (__return_storage_ptr__->m_size).m_data[1] = 0;
    *(undefined8 *)((__return_storage_ptr__->m_size).m_data + 2) = 0;
    (__return_storage_ptr__->m_pitch).m_data[1] = 0;
    (__return_storage_ptr__->m_pitch).m_data[2] = 0;
    __return_storage_ptr__->m_data = (void *)0x0;
    return (ConstPixelBufferAccess *)0x2600000015;
  }
  if ((0x78U >> (uVar2 & 0x1f) & 1) != 0) {
    tcu::getSubregion(__return_storage_ptr__,access,0,0,layer,(access->m_size).m_data[0],
                      (access->m_size).m_data[1],1);
    return (ConstPixelBufferAccess *)(ulong)(uint)layer;
  }
  if ((0x85U >> (uVar2 & 0x1f) & 1) != 0) {
    __return_storage_ptr__->m_format = access->m_format;
    (__return_storage_ptr__->m_size).m_data[2] = (access->m_size).m_data[2];
    *(undefined8 *)(__return_storage_ptr__->m_size).m_data = *(undefined8 *)(access->m_size).m_data;
    *(undefined8 *)(__return_storage_ptr__->m_pitch).m_data =
         *(undefined8 *)(access->m_pitch).m_data;
    (__return_storage_ptr__->m_pitch).m_data[2] = (access->m_pitch).m_data[2];
    pCVar1 = (ConstPixelBufferAccess *)access->m_data;
    __return_storage_ptr__->m_data = pCVar1;
    return pCVar1;
  }
  pCVar1 = tcu::getSubregion(__return_storage_ptr__,access,0,layer,(access->m_size).m_data[0],1);
  return pCVar1;
}

Assistant:

tcu::ConstPixelBufferAccess getLayerOrSlice (const Texture& texture, const tcu::ConstPixelBufferAccess access, const int layer)
{
	switch (texture.type())
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_BUFFER:
			// Not layered
			DE_ASSERT(layer == 0);
			return access;

		case IMAGE_TYPE_1D_ARRAY:
			return tcu::getSubregion(access, 0, layer, access.getWidth(), 1);

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
		case IMAGE_TYPE_3D:			// 3d texture is treated as if depth was the layers
			return tcu::getSubregion(access, 0, 0, layer, access.getWidth(), access.getHeight(), 1);

		default:
			DE_FATAL("Internal test error");
			return tcu::ConstPixelBufferAccess();
	}
}